

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O0

void __thiscall
test_uintwide_t_n_binary_ops_template<24U,_unsigned_char,_void>::initialize
          (test_uintwide_t_n_binary_ops_template<24U,_unsigned_char,_void> *this)

{
  size_t sVar1;
  uintwide_t<24U,_unsigned_char,_void,_false> *puVar2;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar3;
  test_uintwide_t_n_binary_ops_template<24U,_unsigned_char,_void> *this_local;
  
  std::
  vector<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>_>_>
  ::clear(&this->a_local);
  std::
  vector<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>_>_>
  ::clear(&this->b_local);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::clear(&this->a_boost);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::clear(&this->b_boost);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>_>_>
  ::resize(&this->a_local,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>_>_>
  ::resize(&this->b_local,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->a_boost,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->b_boost,sVar1);
  puVar2 = std::
           vector<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>_>_>
           ::data(&this->a_local);
  pnVar3 = std::
           vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ::data(&this->a_boost);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  test_uintwide_t_n_base::
  get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<24u,unsigned_char,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24u,24u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
            (puVar2,pnVar3,sVar1);
  puVar2 = std::
           vector<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>_>_>
           ::data(&this->b_local);
  pnVar3 = std::
           vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ::data(&this->b_boost);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  test_uintwide_t_n_base::
  get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<24u,unsigned_char,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24u,24u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
            (puVar2,pnVar3,sVar1);
  return;
}

Assistant:

auto initialize() -> void override
    {
      a_local.clear();
      b_local.clear();

      a_boost.clear();
      b_boost.clear();

      a_local.resize(size());
      b_local.resize(size());

      a_boost.resize(size());
      b_boost.resize(size());

      get_equal_random_test_values_boost_and_local_n<local_uint_type, boost_uint_type, AllocatorType>(a_local.data(), a_boost.data(), size());
      get_equal_random_test_values_boost_and_local_n<local_uint_type, boost_uint_type, AllocatorType>(b_local.data(), b_boost.data(), size());
    }